

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool __thiscall QDir::cdUp(QDir *this)

{
  bool bVar1;
  QString *this_00;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QString *)QByteArrayView::lengthHelperCharArray("..",3);
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"..";
  QString::fromLatin1((QString *)&QStack_38,this_00,ba);
  bVar1 = cd(this,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::cdUp()
{
    return cd(QString::fromLatin1(".."));
}